

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O2

void __thiscall
HACD::MyMicroAllocator::MyMicroAllocator
          (MyMicroAllocator *this,MicroHeap *heap,void *baseMem,NxU32 initialSize,NxU32 chunkSize)

{
  NxU32 i;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar2;
  EVP_PKEY_CTX *ctx;
  
  (this->super_MicroAllocator)._vptr_MicroAllocator = (_func_int **)&PTR___cxa_pure_virtual_0118e510
  ;
  (this->super_MicroChunkUpdate)._vptr_MicroChunkUpdate =
       (_func_int **)&PTR___cxa_pure_virtual_0118e540;
  MemMutex::MemMutex(&this->super_MemMutex);
  lVar2 = 0x888;
  (this->super_MicroAllocator)._vptr_MicroAllocator = (_func_int **)&PTR_malloc_0118e438;
  (this->super_MicroChunkUpdate)._vptr_MicroChunkUpdate = (_func_int **)&PTR_addMicroChunk_0118e478;
  do {
    FixedMemory::FixedMemory((FixedMemory *)((long)this->mFixedAllocators + lVar2 + -0x50));
    lVar2 = lVar2 + 0x630;
  } while (lVar2 != 0x2da8);
  this->mMicroChunks = (MicroChunk *)0x0;
  this->mMaxMicroChunks = 0;
  this->mMicroChunkCount = 0;
  this->mLastMicroChunk = (MicroChunk *)0x0;
  this->mHeap = heap;
  this->mChunkSize = chunkSize;
  for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
    this->mFixedAllocators[lVar2] = this->mAlloc;
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    this->mFixedAllocators[lVar2 + 9] = this->mAlloc + 1;
  }
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    this->mFixedAllocators[lVar2 + 0x11] = this->mAlloc + 2;
  }
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    this->mFixedAllocators[lVar2 + 0x21] = this->mAlloc + 3;
  }
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    this->mFixedAllocators[lVar2 + 0x41] = this->mAlloc + 4;
  }
  for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 1) {
    this->mFixedAllocators[lVar2 + 0x81] = this->mAlloc + 5;
  }
  this->mBaseMem = (NxU8 *)baseMem;
  ctx = (EVP_PKEY_CTX *)((long)baseMem + 0x2dc8U & 0xfffffffffffffff0);
  this->mBaseMemEnd = (NxU8 *)((ulong)initialSize + (long)baseMem);
  this->mChunkStart = (NxU8 *)ctx;
  iVar1 = FixedMemory::init(this->mAlloc,ctx);
  iVar1 = FixedMemory::init(this->mAlloc + 1,(EVP_PKEY_CTX *)CONCAT44(extraout_var,iVar1));
  iVar1 = FixedMemory::init(this->mAlloc + 2,(EVP_PKEY_CTX *)CONCAT44(extraout_var_00,iVar1));
  iVar1 = FixedMemory::init(this->mAlloc + 3,(EVP_PKEY_CTX *)CONCAT44(extraout_var_01,iVar1));
  iVar1 = FixedMemory::init(this->mAlloc + 4,(EVP_PKEY_CTX *)CONCAT44(extraout_var_02,iVar1));
  iVar1 = FixedMemory::init(this->mAlloc + 5,(EVP_PKEY_CTX *)CONCAT44(extraout_var_03,iVar1));
  this->mChunkEnd = (NxU8 *)CONCAT44(extraout_var_04,iVar1);
  if ((NxU8 *)CONCAT44(extraout_var_04,iVar1) <= this->mBaseMemEnd) {
    return;
  }
  __assert_fail("chunkBase <= mBaseMemEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACD/hacdMicroAllocator.cpp"
                ,0x1b2,"HACD::MyMicroAllocator::MyMicroAllocator(MicroHeap *, void *, NxU32, NxU32)"
               );
}

Assistant:

MyMicroAllocator(MicroHeap *heap,void *baseMem,NxU32 initialSize,NxU32 chunkSize)
  {
    mLastMicroChunk     = 0;
    mMicroChunks        = 0;
    mMicroChunkCount    = 0;
    mMaxMicroChunks		= 0;
	mHeap               = heap;
	mChunkSize          = chunkSize;

    // 0 through 8 bytes
    for (NxU32 i=0; i<=8; i++)
    {
        mFixedAllocators[i] = &mAlloc[0];
    }

    // 9 through 16 bytes
    for (NxU32 i=9; i<=16; i++)
    {
        mFixedAllocators[i] = &mAlloc[1];
    }

    // 17 through 32 bytes
    for (NxU32 i=17; i<=32; i++)
    {
        mFixedAllocators[i] = &mAlloc[2];
    }

    // 33 through 64
    for (NxU32 i=33; i<=64; i++)
    {
        mFixedAllocators[i] = &mAlloc[3];
    }

    // 65 through 128
    for (NxU32 i=65; i<=128; i++)
    {
        mFixedAllocators[i] = &mAlloc[4];
    }

    // 129 through 255
    for (NxU32 i=129; i<257; i++)
    {
        mFixedAllocators[i] = &mAlloc[5];
    }

    mBaseMem = (NxU8 *)baseMem;
    mBaseMemEnd = mBaseMem+initialSize;

    NxU8 *chunkBase = (NxU8 *)baseMem+sizeof(MyMicroAllocator);


    chunkBase+=32;
	NxU64 ptr = (NxU64)chunkBase;
	ptr = ptr>>4;
	ptr = ptr<<4; // make sure it is 16 byte aligned.
	chunkBase = (NxU8 *)ptr;

    mChunkStart = chunkBase;
    chunkBase = mAlloc[0].init(chunkBase,8,chunkSize,heap);
    chunkBase = mAlloc[1].init(chunkBase,16,chunkSize,heap);
    chunkBase = mAlloc[2].init(chunkBase,32,chunkSize,heap);
    chunkBase = mAlloc[3].init(chunkBase,64,chunkSize,heap);
    chunkBase = mAlloc[4].init(chunkBase,128,chunkSize,heap);
    chunkBase = mAlloc[5].init(chunkBase,256,chunkSize,heap);
	mChunkEnd = chunkBase;

    assert(chunkBase <= mBaseMemEnd );

  }